

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O2

void do_cmd_knowledge_traps(char *name,wchar_t row)

{
  ushort uVar1;
  group_funcs g_funcs;
  member_funcs o_funcs;
  int *obj_list;
  trap_kind_conflict *ptVar2;
  wchar_t o_count;
  ulong uVar3;
  long lVar4;
  
  obj_list = (int *)mem_zalloc((ulong)z_info->trap_max << 2);
  uVar1 = z_info->trap_max;
  o_count = L'\0';
  ptVar2 = trap_info;
  for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    if (ptVar2->name != (char *)0x0) {
      lVar4 = (long)o_count;
      o_count = o_count + L'\x01';
      obj_list[lVar4] = (int)uVar3;
    }
    ptVar2 = ptVar2 + 1;
  }
  g_funcs.gcomp = t_cmp_tkind;
  g_funcs.name = tkind_name;
  g_funcs.group = trap_order;
  g_funcs.summary = (_func_void_wchar_t_int_ptr_wchar_t_wchar_t_wchar_t_wchar_t *)0x0;
  g_funcs.maxnum = L'\x06';
  g_funcs.easy_know = false;
  g_funcs._37_3_ = 0;
  o_funcs.lore = trap_lore;
  o_funcs.display_member = display_trap;
  o_funcs.xchar = t_xchar;
  o_funcs.xattr = t_xattr;
  o_funcs.xtra_prompt = trap_prompt;
  o_funcs.xtra_act = t_xtra_act;
  o_funcs._48_8_ = 0;
  display_knowledge("traps",obj_list,o_count,g_funcs,o_funcs,"                    Sym");
  mem_free(obj_list);
  return;
}

Assistant:

static void do_cmd_knowledge_traps(const char *name, int row)
{
	group_funcs tkind_f = {tkind_name, t_cmp_tkind, trap_order, 0,
						   N_ELEMENTS(trap_group_text), false};

	member_funcs trap_f = {display_trap, trap_lore, t_xchar, t_xattr,
						   trap_prompt, t_xtra_act, 0};

	int *traps;
	int t_count = 0;
	int i;

	traps = mem_zalloc(z_info->trap_max * sizeof(int));

	for (i = 0; i < z_info->trap_max; i++) {
		if (!trap_info[i].name) continue;

		traps[t_count++] = i;
	}

	display_knowledge("traps", traps, t_count, tkind_f, trap_f,
					  "                    Sym");
	mem_free(traps);
}